

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUISkin::draw3DTabBody
          (CGUISkin *this,IGUIElement *element,bool border,bool background,rect<int> *rect,
          rect<int> *clip,s32 tabHeight)

{
  IVideoDriver *pIVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  rect<int> tr;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  undefined4 local_34;
  
  if (this->Driver == (IVideoDriver *)0x0) {
    return;
  }
  local_48 = (rect->UpperLeftCorner).X;
  iStack_44 = (rect->UpperLeftCorner).Y;
  iStack_40 = (rect->LowerRightCorner).X;
  iStack_3c = (rect->LowerRightCorner).Y;
  if (tabHeight == -1) {
    tabHeight = (*(this->super_IGUISkin)._vptr_IGUISkin[2])(this,7);
  }
  if (border) {
    local_34 = (undefined4)CONCAT71(in_register_00000009,background);
    if (tr.UpperLeftCorner.X != 0) {
      iStack_3c = (iStack_3c - tabHeight) + -2;
      iStack_40 = local_48 + 1;
      pIVar1 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      iStack_40 = (rect->LowerRightCorner).X;
      local_48 = iStack_40 + -1;
      pIVar1 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      local_48 = (rect->UpperLeftCorner).X;
      iStack_44 = (rect->UpperLeftCorner).Y;
      iStack_40 = (rect->LowerRightCorner).X;
      iStack_3c = iStack_44 + 1;
      pIVar1 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
      background = SUB41(local_34,0);
      goto LAB_00223c9b;
    }
    iStack_44 = iStack_44 + tabHeight + 2;
    iStack_40 = local_48 + 1;
    pIVar1 = this->Driver;
    uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
    (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
    iStack_40 = (rect->LowerRightCorner).X;
    local_48 = iStack_40 + -1;
    pIVar1 = this->Driver;
    uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
    (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
    local_48 = (rect->UpperLeftCorner).X;
    iStack_40 = (rect->LowerRightCorner).X;
    iStack_3c = (rect->LowerRightCorner).Y;
    iStack_44 = iStack_3c + -1;
    pIVar1 = this->Driver;
    uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
    (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
    if ((char)local_34 == '\0') {
      return;
    }
  }
  else {
LAB_00223c9b:
    if (background == false) {
      return;
    }
    if (tr.UpperLeftCorner.X != 0) {
      local_48 = (rect->UpperLeftCorner).X;
      iStack_44 = (rect->UpperLeftCorner).Y;
      iStack_40 = (rect->LowerRightCorner).X;
      iStack_3c = (rect->LowerRightCorner).Y;
      local_48 = local_48 + 1;
      iStack_44 = iStack_44 + -1;
      iStack_40 = iStack_40 + -1;
      iStack_3c = (iStack_3c - tabHeight) + -2;
      goto LAB_00223dcc;
    }
  }
  local_48 = (rect->UpperLeftCorner).X;
  iStack_44 = (rect->UpperLeftCorner).Y;
  iStack_40 = (rect->LowerRightCorner).X;
  iStack_3c = (rect->LowerRightCorner).Y;
  local_48 = (int)DAT_00237960 + local_48;
  iStack_44 = tabHeight + 2 + iStack_44;
  iStack_40 = DAT_00237960._8_4_ + iStack_40;
  iStack_3c = DAT_00237960._12_4_ + iStack_3c;
LAB_00223dcc:
  if (this->UseGradient == false) {
    pIVar1 = this->Driver;
    uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
    (*pIVar1->_vptr_IVideoDriver[0x33])(pIVar1,(ulong)uVar2,&local_48,clip);
  }
  else {
    uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
    uVar3 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
    (*this->Driver->_vptr_IVideoDriver[0x34])
              (this->Driver,&local_48,(ulong)uVar2,(ulong)uVar2,(ulong)uVar3,(ulong)uVar3,clip);
  }
  return;
}

Assistant:

void CGUISkin::draw3DTabBody(IGUIElement *element, bool border, bool background,
		const core::rect<s32> &rect, const core::rect<s32> *clip, s32 tabHeight, EGUI_ALIGNMENT alignment)
{
	if (!Driver)
		return;

	core::rect<s32> tr = rect;

	if (tabHeight == -1)
		tabHeight = getSize(gui::EGDS_BUTTON_HEIGHT);

	// draw border.
	if (border) {
		if (alignment == EGUIA_UPPERLEFT) {
			// draw left hightlight
			tr.UpperLeftCorner.Y += tabHeight + 2;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);

			// draw right shadow
			tr.UpperLeftCorner.X = rect.LowerRightCorner.X - 1;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);

			// draw lower shadow
			tr = rect;
			tr.UpperLeftCorner.Y = tr.LowerRightCorner.Y - 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);
		} else {
			// draw left hightlight
			tr.LowerRightCorner.Y -= tabHeight + 2;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);

			// draw right shadow
			tr.UpperLeftCorner.X = rect.LowerRightCorner.X - 1;
			tr.LowerRightCorner.X = tr.UpperLeftCorner.X + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), tr, clip);

			// draw lower shadow
			tr = rect;
			tr.LowerRightCorner.Y = tr.UpperLeftCorner.Y + 1;
			Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), tr, clip);
		}
	}

	if (background) {
		if (alignment == EGUIA_UPPERLEFT) {
			tr = rect;
			tr.UpperLeftCorner.Y += tabHeight + 2;
			tr.LowerRightCorner.X -= 1;
			tr.UpperLeftCorner.X += 1;
			tr.LowerRightCorner.Y -= 1;
		} else {
			tr = rect;
			tr.UpperLeftCorner.X += 1;
			tr.UpperLeftCorner.Y -= 1;
			tr.LowerRightCorner.X -= 1;
			tr.LowerRightCorner.Y -= tabHeight + 2;
			// tr.UpperLeftCorner.X += 1;
		}

		if (!UseGradient)
			Driver->draw2DRectangle(getColor(EGDC_3D_FACE), tr, clip);
		else {
			video::SColor c1 = getColor(EGDC_3D_FACE);
			video::SColor c2 = getColor(EGDC_3D_SHADOW);
			Driver->draw2DRectangle(tr, c1, c1, c2, c2, clip);
		}
	}
}